

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(MemoryType *expected,MemoryType *actual,string *out_msg)

{
  string local_48;
  string *local_28;
  string *out_msg_local;
  MemoryType *actual_local;
  MemoryType *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  if (expected->page_size == actual->page_size) {
    expected_local._4_4_ = Match(&expected->limits,&actual->limits,out_msg);
  }
  else {
    StringPrintf_abi_cxx11_
              (&local_48,"page_size mismatch in imported memory, expected %u but got %u.",
               (ulong)expected->page_size,(ulong)actual->page_size);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result((Result *)((long)&expected_local + 4),Error);
  }
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const MemoryType& expected,
             const MemoryType& actual,
             std::string* out_msg) {
  if (expected.page_size != actual.page_size) {
    *out_msg = StringPrintf(
        "page_size mismatch in imported memory, expected %u but got %u.",
        expected.page_size, actual.page_size);
    return Result::Error;
  }
  return Match(expected.limits, actual.limits, out_msg);
}